

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

size_t EncodeTree(uint *ll_lengths,uint *d_lengths,int use_16,int use_17,int use_18,uchar *bp,
                 uchar **out,size_t *outsize)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  bool bVar5;
  bool bVar6;
  long in_stack_00000008;
  uint symbol_1;
  uint count2_2;
  uint count2_1;
  uint count2;
  uint count;
  uchar symbol;
  size_t result_size;
  int size_only;
  uint clsymbols [19];
  uint clcl [19];
  size_t clcounts [19];
  size_t j;
  size_t i;
  uint hlit2;
  uint hclen;
  uint hdist;
  uint hlit;
  size_t rle_bits_size;
  size_t rle_size;
  uint *rle_bits;
  uint *rle;
  uint lld_total;
  uint *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdb4;
  size_t *in_stack_fffffffffffffdb8;
  uchar **in_stack_fffffffffffffdc0;
  size_t *in_stack_fffffffffffffdc8;
  uchar **in_stack_fffffffffffffdd0;
  uint symbol_00;
  undefined4 in_stack_fffffffffffffdd8;
  uint in_stack_fffffffffffffddc;
  uint uVar7;
  size_t *in_stack_fffffffffffffde0;
  uchar **local_218;
  size_t *local_210;
  uchar **local_208;
  uint local_1fc;
  size_t *local_1f8;
  uchar **local_1f0;
  uint local_1e8;
  uint local_1e4;
  uint local_1d8;
  uint local_1c0;
  long local_1b8;
  uint local_158 [20];
  long local_108 [19];
  ulong local_70;
  ulong local_68;
  uint local_60;
  int local_5c;
  uint local_58;
  int local_54;
  ulong local_50;
  ulong local_48;
  size_t *local_40;
  uchar **local_38;
  uint local_2c;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  long local_8;
  
  local_38 = (uchar **)0x0;
  local_40 = (size_t *)0x0;
  local_48 = 0;
  local_50 = 0;
  local_54 = 0x1d;
  local_58 = 0x1d;
  bVar5 = in_stack_00000008 != 0;
  for (local_68 = 0; local_68 < 0x13; local_68 = local_68 + 1) {
    local_108[local_68] = 0;
  }
  while( true ) {
    bVar6 = false;
    if (local_54 != 0) {
      bVar6 = *(int *)(in_RDI + (ulong)(local_54 + 0x100) * 4) == 0;
    }
    if (!bVar6) break;
    local_54 = local_54 + -1;
  }
  while( true ) {
    bVar6 = false;
    if (local_58 != 0) {
      bVar6 = *(int *)(in_RSI + (ulong)local_58 * 4) == 0;
    }
    if (!bVar6) break;
    local_58 = local_58 - 1;
  }
  local_60 = local_54 + 0x101U;
  local_2c = local_54 + 0x101U + local_58 + 1;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_68 = 0; local_68 < local_2c; local_68 = local_68 + 1) {
    if (local_68 < local_60) {
      local_1d8 = *(uint *)(local_8 + local_68 * 4);
    }
    else {
      local_1d8 = *(uint *)(local_10 + (local_68 - local_60) * 4);
    }
    bVar1 = (byte)local_1d8;
    local_1c0 = 1;
    if ((local_14 != 0) || ((bVar1 == 0 && ((local_18 != 0 || (local_1c != 0)))))) {
      local_70 = local_68 + 1;
      while( true ) {
        bVar6 = false;
        if (local_70 < local_2c) {
          if (local_70 < local_60) {
            local_1e4 = *(uint *)(local_8 + local_70 * 4);
          }
          else {
            local_1e4 = *(uint *)(local_10 + (local_70 - local_60) * 4);
          }
          bVar6 = (local_1d8 & 0xff) == local_1e4;
        }
        if (!bVar6) break;
        local_1c0 = local_1c0 + 1;
        local_70 = local_70 + 1;
      }
    }
    local_68 = (local_1c0 - 1) + local_68;
    if ((bVar1 == 0) && (2 < local_1c0)) {
      if (local_1c != 0) {
        for (; 10 < local_1c0; local_1c0 = local_1c0 - local_1e8) {
          if (local_1c0 < 0x8b) {
            local_1e8 = local_1c0;
          }
          else {
            local_1e8 = 0x8a;
          }
          if (bVar5) {
            if ((local_48 & local_48 - 1) == 0) {
              if (local_48 == 0) {
                local_1f0 = (uchar **)malloc(4);
              }
              else {
                local_1f0 = (uchar **)realloc(local_38,local_48 << 3);
              }
              local_38 = local_1f0;
            }
            *(undefined4 *)((long)local_38 + local_48 * 4) = 0x12;
            local_48 = local_48 + 1;
            if ((local_50 & local_50 - 1) == 0) {
              if (local_50 == 0) {
                local_1f8 = (size_t *)malloc(4);
              }
              else {
                local_1f8 = (size_t *)realloc(local_40,local_50 << 3);
              }
              local_40 = local_1f8;
            }
            *(uint *)((long)local_40 + local_50 * 4) = local_1e8 - 0xb;
            local_50 = local_50 + 1;
          }
          local_108[0x12] = local_108[0x12] + 1;
        }
      }
      if (local_18 != 0) {
        for (; 2 < local_1c0; local_1c0 = local_1c0 - local_1fc) {
          if (local_1c0 < 0xb) {
            local_1fc = local_1c0;
          }
          else {
            local_1fc = 10;
          }
          if (bVar5) {
            if ((local_48 & local_48 - 1) == 0) {
              if (local_48 == 0) {
                local_208 = (uchar **)malloc(4);
              }
              else {
                local_208 = (uchar **)realloc(local_38,local_48 << 3);
              }
              local_38 = local_208;
            }
            *(undefined4 *)((long)local_38 + local_48 * 4) = 0x11;
            local_48 = local_48 + 1;
            if ((local_50 & local_50 - 1) == 0) {
              if (local_50 == 0) {
                local_210 = (size_t *)malloc(4);
              }
              else {
                local_210 = (size_t *)realloc(local_40,local_50 << 3);
              }
              local_40 = local_210;
            }
            *(uint *)((long)local_40 + local_50 * 4) = local_1fc - 3;
            local_50 = local_50 + 1;
          }
          local_108[0x11] = local_108[0x11] + 1;
        }
      }
    }
    if ((local_14 != 0) && (3 < local_1c0)) {
      local_1c0 = local_1c0 - 1;
      local_108[bVar1] = local_108[bVar1] + 1;
      if (bVar5) {
        if ((local_48 & local_48 - 1) == 0) {
          if (local_48 == 0) {
            local_218 = (uchar **)malloc(4);
          }
          else {
            local_218 = (uchar **)realloc(local_38,local_48 << 3);
          }
          local_38 = local_218;
        }
        *(uint *)((long)local_38 + local_48 * 4) = local_1d8 & 0xff;
        local_48 = local_48 + 1;
        if ((local_50 & local_50 - 1) == 0) {
          if (local_50 == 0) {
            in_stack_fffffffffffffde0 = (size_t *)malloc(4);
          }
          else {
            in_stack_fffffffffffffde0 = (size_t *)realloc(local_40,local_50 << 3);
          }
          local_40 = in_stack_fffffffffffffde0;
        }
        *(undefined4 *)((long)local_40 + local_50 * 4) = 0;
        local_50 = local_50 + 1;
      }
      for (; 2 < local_1c0; local_1c0 = local_1c0 - uVar7) {
        uVar7 = local_1c0;
        if (6 < local_1c0) {
          uVar7 = 6;
        }
        in_stack_fffffffffffffddc = uVar7;
        if (bVar5) {
          if ((local_48 & local_48 - 1) == 0) {
            if (local_48 == 0) {
              in_stack_fffffffffffffdd0 = (uchar **)malloc(4);
            }
            else {
              in_stack_fffffffffffffdd0 = (uchar **)realloc(local_38,local_48 << 3);
            }
            local_38 = in_stack_fffffffffffffdd0;
          }
          *(undefined4 *)((long)local_38 + local_48 * 4) = 0x10;
          local_48 = local_48 + 1;
          if ((local_50 & local_50 - 1) == 0) {
            if (local_50 == 0) {
              in_stack_fffffffffffffdc8 = (size_t *)malloc(4);
            }
            else {
              in_stack_fffffffffffffdc8 = (size_t *)realloc(local_40,local_50 << 3);
            }
            local_40 = in_stack_fffffffffffffdc8;
          }
          *(uint *)((long)local_40 + local_50 * 4) = uVar7 - 3;
          local_50 = local_50 + 1;
        }
        local_108[0x10] = local_108[0x10] + 1;
      }
    }
    local_108[bVar1] = (ulong)local_1c0 + local_108[bVar1];
    for (; local_1c0 != 0; local_1c0 = local_1c0 - 1) {
      if (bVar5) {
        if ((local_48 & local_48 - 1) == 0) {
          if (local_48 == 0) {
            in_stack_fffffffffffffdc0 = (uchar **)malloc(4);
          }
          else {
            in_stack_fffffffffffffdc0 = (uchar **)realloc(local_38,local_48 << 3);
          }
          local_38 = in_stack_fffffffffffffdc0;
        }
        *(uint *)((long)local_38 + local_48 * 4) = local_1d8 & 0xff;
        local_48 = local_48 + 1;
        if ((local_50 & local_50 - 1) == 0) {
          if (local_50 == 0) {
            in_stack_fffffffffffffdb8 = (size_t *)malloc(4);
          }
          else {
            in_stack_fffffffffffffdb8 = (size_t *)realloc(local_40,local_50 << 3);
          }
          local_40 = in_stack_fffffffffffffdb8;
        }
        *(undefined4 *)((long)local_40 + local_50 * 4) = 0;
        local_50 = local_50 + 1;
      }
    }
  }
  ZopfliCalculateBitLengths
            ((size_t *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
             in_stack_fffffffffffffdb4,in_stack_fffffffffffffda8);
  if (bVar5) {
    ZopfliLengthsToSymbols
              ((uint *)in_stack_fffffffffffffde0,
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(uint *)in_stack_fffffffffffffdc8);
  }
  local_5c = 0xf;
  while( true ) {
    bVar6 = false;
    if (local_5c != 0) {
      bVar6 = local_108[EncodeTree::order[local_5c + 3]] == 0;
    }
    if (!bVar6) break;
    local_5c = local_5c + -1;
  }
  if (bVar5) {
    AddBits((uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(uint)in_stack_fffffffffffffdd0,
            (uchar *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    AddBits((uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(uint)in_stack_fffffffffffffdd0,
            (uchar *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    AddBits((uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(uint)in_stack_fffffffffffffdd0,
            (uchar *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    for (local_68 = 0; local_68 < local_5c + 4; local_68 = local_68 + 1) {
      AddBits((uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(uint)in_stack_fffffffffffffdd0,
              (uchar *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8
             );
    }
    for (local_68 = 0; local_68 < local_48; local_68 = local_68 + 1) {
      AddHuffmanBits((uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                     (uint)in_stack_fffffffffffffdd0,(uchar *)in_stack_fffffffffffffdc8,
                     in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      uVar7 = (uint)in_stack_fffffffffffffdd0;
      symbol_00 = (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
      if (*(int *)((long)local_38 + local_68 * 4) == 0x10) {
        AddBits(symbol_00,uVar7,(uchar *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                in_stack_fffffffffffffdb8);
      }
      else if (*(int *)((long)local_38 + local_68 * 4) == 0x11) {
        AddBits(symbol_00,uVar7,(uchar *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                in_stack_fffffffffffffdb8);
      }
      else if (*(int *)((long)local_38 + local_68 * 4) == 0x12) {
        AddBits(symbol_00,uVar7,(uchar *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                in_stack_fffffffffffffdb8);
      }
    }
  }
  local_1b8 = (ulong)(uint)((local_5c + 4) * 3) + 0xe;
  for (local_68 = 0; local_68 < 0x13; local_68 = local_68 + 1) {
    local_1b8 = (ulong)local_158[local_68] * local_108[local_68] + local_1b8;
  }
  lVar2 = local_108[0x10] * 2;
  lVar3 = local_108[0x11] * 3;
  lVar4 = local_108[0x12] * 7;
  free(local_38);
  free(local_40);
  return lVar4 + lVar3 + lVar2 + local_1b8;
}

Assistant:

static size_t EncodeTree(const unsigned* ll_lengths,
                         const unsigned* d_lengths,
                         int use_16, int use_17, int use_18,
                         unsigned char* bp,
                         unsigned char** out, size_t* outsize) {
  unsigned lld_total;  /* Total amount of literal, length, distance codes. */
  /* Runlength encoded version of lengths of litlen and dist trees. */
  unsigned* rle = 0;
  unsigned* rle_bits = 0;  /* Extra bits for rle values 16, 17 and 18. */
  size_t rle_size = 0;  /* Size of rle array. */
  size_t rle_bits_size = 0;  /* Should have same value as rle_size. */
  unsigned hlit = 29;  /* 286 - 257 */
  unsigned hdist = 29;  /* 32 - 1, but gzip does not like hdist > 29.*/
  unsigned hclen;
  unsigned hlit2;
  size_t i, j;
  size_t clcounts[19];
  unsigned clcl[19];  /* Code length code lengths. */
  unsigned clsymbols[19];
  /* The order in which code length code lengths are encoded as per deflate. */
  static const unsigned order[19] = {
    16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15
  };
  int size_only = !out;
  size_t result_size = 0;

  for(i = 0; i < 19; i++) clcounts[i] = 0;

  /* Trim zeros. */
  while (hlit > 0 && ll_lengths[257 + hlit - 1] == 0) hlit--;
  while (hdist > 0 && d_lengths[1 + hdist - 1] == 0) hdist--;
  hlit2 = hlit + 257;

  lld_total = hlit2 + hdist + 1;

  for (i = 0; i < lld_total; i++) {
    /* This is an encoding of a huffman tree, so now the length is a symbol */
    unsigned char symbol = i < hlit2 ? ll_lengths[i] : d_lengths[i - hlit2];
    unsigned count = 1;
    if(use_16 || (symbol == 0 && (use_17 || use_18))) {
      for (j = i + 1; j < lld_total && symbol ==
          (j < hlit2 ? ll_lengths[j] : d_lengths[j - hlit2]); j++) {
        count++;
      }
    }
    i += count - 1;

    /* Repetitions of zeroes */
    if (symbol == 0 && count >= 3) {
      if (use_18) {
        while (count >= 11) {
          unsigned count2 = count > 138 ? 138 : count;
          if (!size_only) {
            ZOPFLI_APPEND_DATA(18, &rle, &rle_size);
            ZOPFLI_APPEND_DATA(count2 - 11, &rle_bits, &rle_bits_size);
          }
          clcounts[18]++;
          count -= count2;
        }
      }
      if (use_17) {
        while (count >= 3) {
          unsigned count2 = count > 10 ? 10 : count;
          if (!size_only) {
            ZOPFLI_APPEND_DATA(17, &rle, &rle_size);
            ZOPFLI_APPEND_DATA(count2 - 3, &rle_bits, &rle_bits_size);
          }
          clcounts[17]++;
          count -= count2;
        }
      }
    }

    /* Repetitions of any symbol */
    if (use_16 && count >= 4) {
      count--;  /* Since the first one is hardcoded. */
      clcounts[symbol]++;
      if (!size_only) {
        ZOPFLI_APPEND_DATA(symbol, &rle, &rle_size);
        ZOPFLI_APPEND_DATA(0, &rle_bits, &rle_bits_size);
      }
      while (count >= 3) {
        unsigned count2 = count > 6 ? 6 : count;
        if (!size_only) {
          ZOPFLI_APPEND_DATA(16, &rle, &rle_size);
          ZOPFLI_APPEND_DATA(count2 - 3, &rle_bits, &rle_bits_size);
        }
        clcounts[16]++;
        count -= count2;
      }
    }

    /* No or insufficient repetition */
    clcounts[symbol] += count;
    while (count > 0) {
      if (!size_only) {
        ZOPFLI_APPEND_DATA(symbol, &rle, &rle_size);
        ZOPFLI_APPEND_DATA(0, &rle_bits, &rle_bits_size);
      }
      count--;
    }
  }

  ZopfliCalculateBitLengths(clcounts, 19, 7, clcl);
  if (!size_only) ZopfliLengthsToSymbols(clcl, 19, 7, clsymbols);

  hclen = 15;
  /* Trim zeros. */
  while (hclen > 0 && clcounts[order[hclen + 4 - 1]] == 0) hclen--;

  if (!size_only) {
    AddBits(hlit, 5, bp, out, outsize);
    AddBits(hdist, 5, bp, out, outsize);
    AddBits(hclen, 4, bp, out, outsize);

    for (i = 0; i < hclen + 4; i++) {
      AddBits(clcl[order[i]], 3, bp, out, outsize);
    }

    for (i = 0; i < rle_size; i++) {
      unsigned symbol = clsymbols[rle[i]];
      AddHuffmanBits(symbol, clcl[rle[i]], bp, out, outsize);
      /* Extra bits. */
      if (rle[i] == 16) AddBits(rle_bits[i], 2, bp, out, outsize);
      else if (rle[i] == 17) AddBits(rle_bits[i], 3, bp, out, outsize);
      else if (rle[i] == 18) AddBits(rle_bits[i], 7, bp, out, outsize);
    }
  }

  result_size += 14;  /* hlit, hdist, hclen bits */
  result_size += (hclen + 4) * 3;  /* clcl bits */
  for(i = 0; i < 19; i++) {
    result_size += clcl[i] * clcounts[i];
  }
  /* Extra bits. */
  result_size += clcounts[16] * 2;
  result_size += clcounts[17] * 3;
  result_size += clcounts[18] * 7;

  /* Note: in case of "size_only" these are null pointers so no effect. */
  free(rle);
  free(rle_bits);

  return result_size;
}